

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O1

void __thiscall
solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests_getCoveredCardsPosition_Test::
~StockPileColliderGetCoveredCardsPositionTests_getCoveredCardsPosition_Test
          (StockPileColliderGetCoveredCardsPositionTests_getCoveredCardsPosition_Test *this)

{
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  *this_00;
  
  this_00 = &this[-1].super_StockPileColliderGetCoveredCardsPositionTests.
             super_StockPileColliderTests.super_Test.gtest_flag_saver_;
  this[-1].super_StockPileColliderGetCoveredCardsPositionTests.super_StockPileColliderTests.
  super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__StockPileColliderTests_00326488;
  this[-1].super_StockPileColliderGetCoveredCardsPositionTests.super_StockPileColliderTests.
  stockPileMock.gmock02_initialize_11.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__StockPileMock_003214f0;
  testing::internal::FunctionMocker<std::optional<unsigned_int>_()>::~FunctionMocker
            ((FunctionMocker<std::optional<unsigned_int>_()> *)
             &this[-1].super_StockPileColliderGetCoveredCardsPositionTests.
              super_StockPileColliderTests.stockPileMock.gmock10_getSelectedCardIndex_17.
              super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::
  FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::~FunctionMocker((FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                     *)&this[-1].super_StockPileColliderGetCoveredCardsPositionTests.
                        super_StockPileColliderTests.stockPileMock.gmock10_getCards_16.
                        super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::FunctionMocker<std::optional<solitaire::cards::Card>_()>::~FunctionMocker
            ((FunctionMocker<std::optional<solitaire::cards::Card>_()> *)
             &this[-1].super_StockPileColliderGetCoveredCardsPositionTests.
              super_StockPileColliderTests.stockPileMock.gmock00_tryPullOutCard_15.
              super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker
            ((FunctionMocker<void_()> *)
             &this[-1].super_StockPileColliderGetCoveredCardsPositionTests.
              super_StockPileColliderTests.stockPileMock.gmock00_trySelectNextCard_14.
              super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::
  FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::~FunctionMocker((FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                     *)&this[-1].super_StockPileColliderGetCoveredCardsPositionTests.
                        super_StockPileColliderTests.stockPileMock.gmock00_createSnapshot_13.
                        super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::
  FunctionMocker<void_(const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&)>
  ::~FunctionMocker((FunctionMocker<void_(const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&)>
                     *)&this[-1].super_StockPileColliderGetCoveredCardsPositionTests.
                        super_StockPileColliderTests.stockPileMock.gmock02_initialize_11.
                        super_UntypedFunctionMockerBase.mock_obj_);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x1e0);
  return;
}

Assistant:

TEST_P(StockPileColliderGetCoveredCardsPositionTests, getCoveredCardsPosition) {
    const auto& coveredCardsPositionData = GetParam();
    Cards cards {coveredCardsPositionData.cardsQuantity};
    EXPECT_CALL(stockPileMock, getCards()).WillOnce(ReturnRef(cards));
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillOnce(Return(coveredCardsPositionData.selectedCardIndex));

    EXPECT_EQ(
        collider.getCoveredCardsPosition(),
        coveredCardsPositionData.position
    );
}